

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_6d004::TargetTask::provideValue
          (TargetTask *this,TaskInterface param_1,uintptr_t inputID,KeyType *key,
          ValueType *valueData)

{
  BuildValue value;
  BinaryDecoder local_a0;
  BuildValue local_88;
  
  local_a0.data.Data =
       (char *)(valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
  local_a0.data.Length =
       (size_t)((valueData->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish + -(long)local_a0.data.Data);
  local_a0.pos = 0;
  llbuild::buildsystem::BuildValue::BuildValue(&local_88,&local_a0);
  if (local_88.kind == MissingInput) {
    llvm::SmallPtrSetImpl<llbuild::buildsystem::Node_*>::insert
              ((pair<llvm::SmallPtrSetIterator<llbuild::buildsystem::Node_*>,_bool> *)&local_a0,
               &(this->missingInputNodes).super_SmallPtrSetImpl<llbuild::buildsystem::Node_*>,
               (this->target->nodes).
               super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
               ._M_impl.super__Vector_impl_data._M_start[inputID]);
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_88);
  return;
}

Assistant:

virtual void provideValue(TaskInterface, uintptr_t inputID,
                            const KeyType& key, const ValueType& valueData) override {
    // Do nothing.
    auto value = BuildValue::fromData(valueData);

    if (value.isMissingInput()) {
      missingInputNodes.insert(target.getNodes()[inputID]);
    }
  }